

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

void __thiscall t_xml_generator::generate_constant(t_xml_generator *this,t_const *con)

{
  t_type *ttype;
  t_const_value *value;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  t_const *local_18;
  t_const *con_local;
  t_xml_generator *this_local;
  
  local_18 = con;
  con_local = (t_const *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"const",&local_39);
  write_element_start(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"name",&local_71);
  t_const::get_name_abi_cxx11_(&local_98,local_18);
  write_attribute(this,&local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  write_doc(this,&local_18->super_t_doc);
  ttype = t_const::get_type(local_18);
  write_type(this,ttype);
  value = t_const::get_value(local_18);
  write_const_value(this,value);
  write_element_end(this);
  return;
}

Assistant:

void t_xml_generator::generate_constant(t_const* con) {
  write_element_start("const");
  write_attribute("name", con->get_name());
  write_doc(con);
  write_type(con->get_type());
  write_const_value(con->get_value());
  write_element_end();
}